

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void PrintMiscActorInfo(AActor *query)

{
  double dVar1;
  AActor *pAVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  ActorFlags *other;
  ActorFlags2 *other_00;
  ActorFlags3 *other_01;
  ActorFlags4 *other_02;
  ActorFlags5 *other_03;
  ActorFlags6 *other_04;
  ActorFlags7 *other_05;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  char *local_d0;
  char *local_b8;
  TFlags<ActorFlag7,_unsigned_int> local_60;
  TFlags<ActorFlag7,_unsigned_int> local_5c;
  TFlags<ActorFlag6,_unsigned_int> local_58;
  TFlags<ActorFlag6,_unsigned_int> local_54;
  TFlags<ActorFlag5,_unsigned_int> local_50;
  TFlags<ActorFlag5,_unsigned_int> local_4c;
  TFlags<ActorFlag4,_unsigned_int> local_48;
  TFlags<ActorFlag4,_unsigned_int> local_44;
  TFlags<ActorFlag3,_unsigned_int> local_40;
  TFlags<ActorFlag3,_unsigned_int> local_3c;
  TFlags<ActorFlag2,_unsigned_int> local_38;
  TFlags<ActorFlag2,_unsigned_int> local_34;
  TFlags<ActorFlag,_unsigned_int> local_30;
  TFlags<ActorFlag,_unsigned_int> local_2c;
  FLineSpecial *local_28;
  FLineSpecial *spec;
  uint local_18;
  int style;
  int querystyle;
  int flagi;
  AActor *query_local;
  
  if (query != (AActor *)0x0) {
    local_18 = 0xe;
    _querystyle = query;
    for (spec._4_4_ = 0; (int)spec._4_4_ < 0xe; spec._4_4_ = spec._4_4_ + 1) {
      bVar3 = FRenderStyle::operator==
                        ((FRenderStyle *)&LegacyRenderStyles[(int)spec._4_4_].field_0,
                         &_querystyle->RenderStyle);
      if (bVar3) {
        local_18 = spec._4_4_;
        break;
      }
    }
    local_28 = P_GetLineSpecialInfo(_querystyle->special);
    pcVar7 = AActor::GetTag(_querystyle,(char *)0x0);
    pAVar2 = _querystyle;
    uVar5 = TFlags<ActorFlag,_unsigned_int>::GetValue(&_querystyle->flags);
    Printf("%s @ %p has the following flags:\n   flags: %x",pcVar7,pAVar2,(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other = &_querystyle->flags;
      TFlags<ActorFlag,_unsigned_int>::FromInt(&local_30,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_2c,other);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),0x18c);
        Printf(" %s",pcVar7);
      }
    }
    uVar5 = TFlags<ActorFlag2,_unsigned_int>::GetValue(&_querystyle->flags2);
    Printf("\n   flags2: %x",(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other_00 = &_querystyle->flags2;
      TFlags<ActorFlag2,_unsigned_int>::FromInt(&local_38,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag2,_unsigned_int>::operator&(&local_34,other_00);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),400);
        Printf(" %s",pcVar7);
      }
    }
    uVar5 = TFlags<ActorFlag3,_unsigned_int>::GetValue(&_querystyle->flags3);
    Printf("\n   flags3: %x",(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other_01 = &_querystyle->flags3;
      TFlags<ActorFlag3,_unsigned_int>::FromInt(&local_40,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag3,_unsigned_int>::operator&(&local_3c,other_01);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),0x194);
        Printf(" %s",pcVar7);
      }
    }
    uVar5 = TFlags<ActorFlag4,_unsigned_int>::GetValue(&_querystyle->flags4);
    Printf("\n   flags4: %x",(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other_02 = &_querystyle->flags4;
      TFlags<ActorFlag4,_unsigned_int>::FromInt(&local_48,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag4,_unsigned_int>::operator&(&local_44,other_02);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),0x198);
        Printf(" %s",pcVar7);
      }
    }
    uVar5 = TFlags<ActorFlag5,_unsigned_int>::GetValue(&_querystyle->flags5);
    Printf("\n   flags5: %x",(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other_03 = &_querystyle->flags5;
      TFlags<ActorFlag5,_unsigned_int>::FromInt(&local_50,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag5,_unsigned_int>::operator&(&local_4c,other_03);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),0x19c);
        Printf(" %s",pcVar7);
      }
    }
    uVar5 = TFlags<ActorFlag6,_unsigned_int>::GetValue(&_querystyle->flags6);
    Printf("\n   flags6: %x",(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other_04 = &_querystyle->flags6;
      TFlags<ActorFlag6,_unsigned_int>::FromInt(&local_58,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag6,_unsigned_int>::operator&(&local_54,other_04);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),0x1a0);
        Printf(" %s",pcVar7);
      }
    }
    uVar5 = TFlags<ActorFlag7,_unsigned_int>::GetValue(&_querystyle->flags7);
    Printf("\n   flags7: %x",(ulong)uVar5);
    for (style = 0; style < 0x20; style = style + 1) {
      other_05 = &_querystyle->flags7;
      TFlags<ActorFlag7,_unsigned_int>::FromInt(&local_60,1 << ((byte)style & 0x1f));
      TFlags<ActorFlag7,_unsigned_int>::operator&(&local_5c,other_05);
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
      if (uVar5 != 0) {
        pcVar7 = GetFlagName(1 << ((byte)style & 0x1f),0x1a4);
        Printf(" %s",pcVar7);
      }
    }
    uVar4 = TFlags<ActorBounceFlag,_unsigned_short>::GetValue(&_querystyle->BounceFlags);
    Printf("\nBounce flags: %x\nBounce factors: f:%f, w:%f",_querystyle->bouncefactor,
           _querystyle->wallbouncefactor,(ulong)uVar4);
    uVar5 = local_18;
    if ((int)local_18 < 0xe) {
      local_b8 = PrintMiscActorInfo::renderstyles[(int)local_18];
    }
    else {
      local_b8 = "Unknown";
    }
    dVar8 = _querystyle->Alpha;
    uVar6 = TFlags<ActorRenderFlag,_unsigned_int>::GetValue(&_querystyle->renderflags);
    Printf("\nRender style = %i:%s, alpha %f\nRender flags: %x",dVar8,(ulong)uVar5,local_b8,
           (ulong)uVar6);
    if (local_28 == (FLineSpecial *)0x0) {
      local_d0 = "None";
    }
    else {
      local_d0 = local_28->name;
    }
    Printf("\nSpecial+args: %s(%i, %i, %i, %i, %i)\nspecial1: %i, special2: %i.",local_d0,
           (ulong)(uint)_querystyle->args[0],(ulong)(uint)_querystyle->args[1],
           (ulong)(uint)_querystyle->args[2],(ulong)(uint)_querystyle->args[3],_querystyle->args[4],
           _querystyle->special1,_querystyle->special2);
    Printf("\nTID: %d",(ulong)(uint)_querystyle->tid);
    dVar8 = AActor::X(_querystyle);
    dVar9 = AActor::Y(_querystyle);
    dVar10 = AActor::Z(_querystyle);
    Printf("\nCoord= x: %f, y: %f, z:%f, floor:%f, ceiling:%f.",dVar8,dVar9,dVar10,
           _querystyle->floorz,_querystyle->ceilingz);
    dVar8 = _querystyle->Speed;
    dVar9 = (_querystyle->Vel).X;
    dVar10 = (_querystyle->Vel).Y;
    dVar1 = (_querystyle->Vel).Z;
    dVar11 = TVector3<double>::Length(&_querystyle->Vel);
    Printf("\nSpeed= %f, velocity= x:%f, y:%f, z:%f, combined:%f.\n",dVar8,dVar9,dVar10,dVar1,dVar11
          );
  }
  return;
}

Assistant:

void PrintMiscActorInfo(AActor *query)
{
	if (query)
	{
		int flagi;
		int querystyle = STYLE_Count;
		for (int style = STYLE_None; style < STYLE_Count; ++style)
		{ // Check for a legacy render style that matches.
			if (LegacyRenderStyles[style] == query->RenderStyle)
			{
				querystyle = style;
				break;
			}
		}
		static const char * renderstyles[]= {"None", "Normal", "Fuzzy", "SoulTrans",
			"OptFuzzy", "Stencil", "Translucent", "Add", "Shaded", "TranslucentStencil",
			"Shadow", "Subtract", "AddStencil", "AddShaded"};

		FLineSpecial *spec = P_GetLineSpecialInfo(query->special);

		Printf("%s @ %p has the following flags:\n   flags: %x", query->GetTag(), query, query->flags.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags & ActorFlags::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags));
		Printf("\n   flags2: %x", query->flags2.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags2 & ActorFlags2::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags2));
		Printf("\n   flags3: %x", query->flags3.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags3 & ActorFlags3::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags3));
		Printf("\n   flags4: %x", query->flags4.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags4 & ActorFlags4::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags4));
		Printf("\n   flags5: %x", query->flags5.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags5 & ActorFlags5::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags5));
		Printf("\n   flags6: %x", query->flags6.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags6 & ActorFlags6::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags6));
		Printf("\n   flags7: %x", query->flags7.GetValue());
		for (flagi = 0; flagi <= 31; flagi++)
			if (query->flags7 & ActorFlags7::FromInt(1<<flagi)) Printf(" %s", FLAG_NAME(1<<flagi, flags7));
		Printf("\nBounce flags: %x\nBounce factors: f:%f, w:%f", 
			query->BounceFlags.GetValue(), query->bouncefactor,
			query->wallbouncefactor);
		/*for (flagi = 0; flagi < 31; flagi++)
			if (query->BounceFlags & 1<<flagi) Printf(" %s", flagnamesb[flagi]);*/
		Printf("\nRender style = %i:%s, alpha %f\nRender flags: %x", 
			querystyle, (querystyle < STYLE_Count ? renderstyles[querystyle] : "Unknown"),
			query->Alpha, query->renderflags.GetValue());
		/*for (flagi = 0; flagi < 31; flagi++)
			if (query->renderflags & 1<<flagi) Printf(" %s", flagnamesr[flagi]);*/
		Printf("\nSpecial+args: %s(%i, %i, %i, %i, %i)\nspecial1: %i, special2: %i.",
			(spec ? spec->name : "None"),
			query->args[0], query->args[1], query->args[2], query->args[3], 
			query->args[4],	query->special1, query->special2);
		Printf("\nTID: %d", query->tid);
		Printf("\nCoord= x: %f, y: %f, z:%f, floor:%f, ceiling:%f.",
			query->X(), query->Y(), query->Z(),
			query->floorz, query->ceilingz);
		Printf("\nSpeed= %f, velocity= x:%f, y:%f, z:%f, combined:%f.\n",
			query->Speed, query->Vel.X, query->Vel.Y, query->Vel.Z, query->Vel.Length());
	}
}